

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageLoader.cpp
# Opt level: O1

bool __thiscall
sf::priv::ImageLoader::saveImageToMemory
          (ImageLoader *this,string *format,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *output,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pixels,Vector2u *size)

{
  uint x;
  uint y;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  uchar *__first;
  ostream *poVar4;
  char *pcVar5;
  Uint8 *source;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *dest;
  string specified;
  int len;
  char *local_c8 [2];
  char local_b8 [8];
  undefined8 uStack_b0;
  char *local_a8;
  long local_a0;
  char local_98 [8];
  undefined8 uStack_90;
  stbi__write_context local_88;
  
  if ((((pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish) || (size->x == 0)) || (size->y == 0)) goto LAB_00162d49;
  pcVar1 = (format->_M_dataplus)._M_p;
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + format->_M_string_length);
  pcVar5 = local_a8;
  if (local_a0 != 0) {
    do {
      iVar3 = tolower((int)*pcVar5);
      *pcVar5 = (char)iVar3;
      pcVar5 = pcVar5 + 1;
    } while (pcVar5 != local_a8 + local_a0);
  }
  local_c8[0] = local_a8;
  if (local_a8 == local_98) {
    uStack_b0 = uStack_90;
    local_c8[0] = local_b8;
  }
  local_a0 = 0;
  local_98[0] = '\0';
  x = size->x;
  y = size->y;
  local_a8 = local_98;
  iVar3 = std::__cxx11::string::compare((char *)local_c8);
  if (iVar3 == 0) {
    local_88.buffer[0x30] = '\0';
    local_88.buffer[0x31] = '\0';
    local_88.buffer[0x32] = '\0';
    local_88.buffer[0x33] = '\0';
    local_88.buffer[0x34] = '\0';
    local_88.buffer[0x35] = '\0';
    local_88.buffer[0x36] = '\0';
    local_88.buffer[0x37] = '\0';
    local_88.buffer[0x38] = '\0';
    local_88.buffer[0x39] = '\0';
    local_88.buffer[0x3a] = '\0';
    local_88.buffer[0x3b] = '\0';
    local_88.buffer[0x3c] = '\0';
    local_88.buffer[0x3d] = '\0';
    local_88.buffer[0x3e] = '\0';
    local_88.buffer[0x3f] = '\0';
    local_88.buffer[0x20] = '\0';
    local_88.buffer[0x21] = '\0';
    local_88.buffer[0x22] = '\0';
    local_88.buffer[0x23] = '\0';
    local_88.buffer[0x24] = '\0';
    local_88.buffer[0x25] = '\0';
    local_88.buffer[0x26] = '\0';
    local_88.buffer[0x27] = '\0';
    local_88.buffer[0x28] = '\0';
    local_88.buffer[0x29] = '\0';
    local_88.buffer[0x2a] = '\0';
    local_88.buffer[0x2b] = '\0';
    local_88.buffer[0x2c] = '\0';
    local_88.buffer[0x2d] = '\0';
    local_88.buffer[0x2e] = '\0';
    local_88.buffer[0x2f] = '\0';
    local_88.buffer[0x10] = '\0';
    local_88.buffer[0x11] = '\0';
    local_88.buffer[0x12] = '\0';
    local_88.buffer[0x13] = '\0';
    local_88.buffer[0x14] = '\0';
    local_88.buffer[0x15] = '\0';
    local_88.buffer[0x16] = '\0';
    local_88.buffer[0x17] = '\0';
    local_88.buffer[0x18] = '\0';
    local_88.buffer[0x19] = '\0';
    local_88.buffer[0x1a] = '\0';
    local_88.buffer[0x1b] = '\0';
    local_88.buffer[0x1c] = '\0';
    local_88.buffer[0x1d] = '\0';
    local_88.buffer[0x1e] = '\0';
    local_88.buffer[0x1f] = '\0';
    local_88.buffer[0] = '\0';
    local_88.buffer[1] = '\0';
    local_88.buffer[2] = '\0';
    local_88.buffer[3] = '\0';
    local_88.buffer[4] = '\0';
    local_88.buffer[5] = '\0';
    local_88.buffer[6] = '\0';
    local_88.buffer[7] = '\0';
    local_88.buffer[8] = '\0';
    local_88.buffer[9] = '\0';
    local_88.buffer[10] = '\0';
    local_88.buffer[0xb] = '\0';
    local_88.buffer[0xc] = '\0';
    local_88.buffer[0xd] = '\0';
    local_88.buffer[0xe] = '\0';
    local_88.buffer[0xf] = '\0';
    local_88.buf_used = 0;
    local_88._84_4_ = 0;
    local_88.func = anon_unknown.dwarf_249915::bufferFromCallback;
    local_88.context = output;
    iVar3 = stbi_write_bmp_core(&local_88,x,y,4,
                                (pixels->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start);
LAB_00162ce4:
    if (iVar3 != 0) goto LAB_00162ce8;
LAB_00162d30:
    bVar2 = true;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)local_c8);
    if (iVar3 == 0) {
      local_88.buffer[0x30] = '\0';
      local_88.buffer[0x31] = '\0';
      local_88.buffer[0x32] = '\0';
      local_88.buffer[0x33] = '\0';
      local_88.buffer[0x34] = '\0';
      local_88.buffer[0x35] = '\0';
      local_88.buffer[0x36] = '\0';
      local_88.buffer[0x37] = '\0';
      local_88.buffer[0x38] = '\0';
      local_88.buffer[0x39] = '\0';
      local_88.buffer[0x3a] = '\0';
      local_88.buffer[0x3b] = '\0';
      local_88.buffer[0x3c] = '\0';
      local_88.buffer[0x3d] = '\0';
      local_88.buffer[0x3e] = '\0';
      local_88.buffer[0x3f] = '\0';
      local_88.buffer[0x20] = '\0';
      local_88.buffer[0x21] = '\0';
      local_88.buffer[0x22] = '\0';
      local_88.buffer[0x23] = '\0';
      local_88.buffer[0x24] = '\0';
      local_88.buffer[0x25] = '\0';
      local_88.buffer[0x26] = '\0';
      local_88.buffer[0x27] = '\0';
      local_88.buffer[0x28] = '\0';
      local_88.buffer[0x29] = '\0';
      local_88.buffer[0x2a] = '\0';
      local_88.buffer[0x2b] = '\0';
      local_88.buffer[0x2c] = '\0';
      local_88.buffer[0x2d] = '\0';
      local_88.buffer[0x2e] = '\0';
      local_88.buffer[0x2f] = '\0';
      local_88.buffer[0x10] = '\0';
      local_88.buffer[0x11] = '\0';
      local_88.buffer[0x12] = '\0';
      local_88.buffer[0x13] = '\0';
      local_88.buffer[0x14] = '\0';
      local_88.buffer[0x15] = '\0';
      local_88.buffer[0x16] = '\0';
      local_88.buffer[0x17] = '\0';
      local_88.buffer[0x18] = '\0';
      local_88.buffer[0x19] = '\0';
      local_88.buffer[0x1a] = '\0';
      local_88.buffer[0x1b] = '\0';
      local_88.buffer[0x1c] = '\0';
      local_88.buffer[0x1d] = '\0';
      local_88.buffer[0x1e] = '\0';
      local_88.buffer[0x1f] = '\0';
      local_88.buffer[0] = '\0';
      local_88.buffer[1] = '\0';
      local_88.buffer[2] = '\0';
      local_88.buffer[3] = '\0';
      local_88.buffer[4] = '\0';
      local_88.buffer[5] = '\0';
      local_88.buffer[6] = '\0';
      local_88.buffer[7] = '\0';
      local_88.buffer[8] = '\0';
      local_88.buffer[9] = '\0';
      local_88.buffer[10] = '\0';
      local_88.buffer[0xb] = '\0';
      local_88.buffer[0xc] = '\0';
      local_88.buffer[0xd] = '\0';
      local_88.buffer[0xe] = '\0';
      local_88.buffer[0xf] = '\0';
      local_88.buf_used = 0;
      local_88._84_4_ = 0;
      local_88.func = anon_unknown.dwarf_249915::bufferFromCallback;
      local_88.context = output;
      iVar3 = stbi_write_tga_core(&local_88,x,y,4,
                                  (pixels->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_start);
      goto LAB_00162ce4;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_c8);
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)local_c8);
      if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)local_c8), iVar3 == 0)) {
        local_88.buffer[0x30] = '\0';
        local_88.buffer[0x31] = '\0';
        local_88.buffer[0x32] = '\0';
        local_88.buffer[0x33] = '\0';
        local_88.buffer[0x34] = '\0';
        local_88.buffer[0x35] = '\0';
        local_88.buffer[0x36] = '\0';
        local_88.buffer[0x37] = '\0';
        local_88.buffer[0x38] = '\0';
        local_88.buffer[0x39] = '\0';
        local_88.buffer[0x3a] = '\0';
        local_88.buffer[0x3b] = '\0';
        local_88.buffer[0x3c] = '\0';
        local_88.buffer[0x3d] = '\0';
        local_88.buffer[0x3e] = '\0';
        local_88.buffer[0x3f] = '\0';
        local_88.buffer[0x20] = '\0';
        local_88.buffer[0x21] = '\0';
        local_88.buffer[0x22] = '\0';
        local_88.buffer[0x23] = '\0';
        local_88.buffer[0x24] = '\0';
        local_88.buffer[0x25] = '\0';
        local_88.buffer[0x26] = '\0';
        local_88.buffer[0x27] = '\0';
        local_88.buffer[0x28] = '\0';
        local_88.buffer[0x29] = '\0';
        local_88.buffer[0x2a] = '\0';
        local_88.buffer[0x2b] = '\0';
        local_88.buffer[0x2c] = '\0';
        local_88.buffer[0x2d] = '\0';
        local_88.buffer[0x2e] = '\0';
        local_88.buffer[0x2f] = '\0';
        local_88.buffer[0x10] = '\0';
        local_88.buffer[0x11] = '\0';
        local_88.buffer[0x12] = '\0';
        local_88.buffer[0x13] = '\0';
        local_88.buffer[0x14] = '\0';
        local_88.buffer[0x15] = '\0';
        local_88.buffer[0x16] = '\0';
        local_88.buffer[0x17] = '\0';
        local_88.buffer[0x18] = '\0';
        local_88.buffer[0x19] = '\0';
        local_88.buffer[0x1a] = '\0';
        local_88.buffer[0x1b] = '\0';
        local_88.buffer[0x1c] = '\0';
        local_88.buffer[0x1d] = '\0';
        local_88.buffer[0x1e] = '\0';
        local_88.buffer[0x1f] = '\0';
        local_88.buffer[0] = '\0';
        local_88.buffer[1] = '\0';
        local_88.buffer[2] = '\0';
        local_88.buffer[3] = '\0';
        local_88.buffer[4] = '\0';
        local_88.buffer[5] = '\0';
        local_88.buffer[6] = '\0';
        local_88.buffer[7] = '\0';
        local_88.buffer[8] = '\0';
        local_88.buffer[9] = '\0';
        local_88.buffer[10] = '\0';
        local_88.buffer[0xb] = '\0';
        local_88.buffer[0xc] = '\0';
        local_88.buffer[0xd] = '\0';
        local_88.buffer[0xe] = '\0';
        local_88.buffer[0xf] = '\0';
        local_88.buf_used = 0;
        local_88._84_4_ = 0;
        local_88.func = anon_unknown.dwarf_249915::bufferFromCallback;
        local_88.context = output;
        iVar3 = stbi_write_jpg_core(&local_88,x,y,4,
                                    (pixels->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_start,0x5a);
        goto LAB_00162ce4;
      }
      goto LAB_00162d30;
    }
    __first = stbi_write_png_to_mem
                        ((pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                         ._M_impl.super__Vector_impl_data._M_start,0,x,y,4,(int *)&local_88);
    if (__first == (uchar *)0x0) goto LAB_00162d30;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (__first,__first + (int)local_88.func,
               (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
               output);
    free(__first);
    if (__first == (uchar *)0x0) goto LAB_00162d30;
LAB_00162ce8:
    bVar2 = false;
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0]);
  }
  if (!bVar2) {
    return true;
  }
LAB_00162d49:
  poVar4 = err();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"Failed to save image with format \"",0x22);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(format->_M_dataplus)._M_p,format->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return false;
}

Assistant:

bool ImageLoader::saveImageToMemory(const std::string& format, std::vector<sf::Uint8>& output, const std::vector<Uint8>& pixels, const Vector2u& size)
{
    // Make sure the image is not empty
    if (!pixels.empty() && (size.x > 0) && (size.y > 0))
    {
        // Choose function based on format

        std::string specified = toLower(format);
        const Vector2i convertedSize = Vector2i(size);

        if (specified == "bmp")
        {
            // BMP format
            if (stbi_write_bmp_to_func(&bufferFromCallback, &output, convertedSize.x, convertedSize.y, 4, &pixels[0]))
                return true;
        }
        else if (specified == "tga")
        {
            // TGA format
            if (stbi_write_tga_to_func(&bufferFromCallback, &output, convertedSize.x, convertedSize.y, 4, &pixels[0]))
                return true;
        }
        else if (specified == "png")
        {
            // PNG format
            if (stbi_write_png_to_func(&bufferFromCallback, &output, convertedSize.x, convertedSize.y, 4, &pixels[0], 0))
                return true;
        }
        else if (specified == "jpg" || specified == "jpeg")
        {
            // JPG format
            if (stbi_write_jpg_to_func(&bufferFromCallback, &output, convertedSize.x, convertedSize.y, 4, &pixels[0], 90))
                return true;
        }
    }

    err() << "Failed to save image with format \"" << format << "\"" << std::endl;
    return false;
}